

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepInnerStepper_SetResetFn(MRIStepInnerStepper stepper,MRIStepInnerResetFn fn)

{
  undefined8 in_RSI;
  long in_RDI;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepInnerStepper_SetResetFn",
                    "Inner stepper memory is NULL");
    local_4 = -0x16;
  }
  else if (*(long *)(in_RDI + 8) == 0) {
    arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepInnerStepper_SetResetFn",
                    "Inner stepper operations structure is NULL");
    local_4 = -0x16;
  }
  else {
    *(undefined8 *)(*(long *)(in_RDI + 8) + 0x10) = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepInnerStepper_SetResetFn(MRIStepInnerStepper stepper,
                                   MRIStepInnerResetFn fn)
{
  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepInnerStepper_SetResetFn",
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  if (stepper->ops == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepInnerStepper_SetResetFn",
                    "Inner stepper operations structure is NULL");
    return ARK_ILL_INPUT;
  }

  stepper->ops->reset = fn;

  return ARK_SUCCESS;
}